

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

String * __thiscall
capnp::JsonCodec::encode<capnp::DynamicStruct::Reader>
          (String *__return_storage_ptr__,JsonCodec *this,Reader *value)

{
  Reader *pRVar1;
  Reader local_b8;
  Reader local_78;
  undefined1 auStack_30 [8];
  Type type;
  Reader *value_local;
  JsonCodec *this_local;
  
  type.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)value;
  _auStack_30 = capnp::Type::from<capnp::DynamicStruct::Reader&>(value);
  pRVar1 = kj::fwd<capnp::DynamicStruct::Reader>
                     ((NoInfer<capnp::DynamicStruct::Reader> *)type.field_4.schema);
  local_b8.reader.nestingLimit = (pRVar1->reader).nestingLimit;
  local_b8.reader._44_4_ = *(undefined4 *)&(pRVar1->reader).field_0x2c;
  local_b8.schema.super_Schema.raw = (Schema)(pRVar1->schema).super_Schema.raw;
  local_b8.reader.segment = (pRVar1->reader).segment;
  local_b8.reader.capTable = (pRVar1->reader).capTable;
  local_b8.reader.data = (pRVar1->reader).data;
  local_b8.reader.pointers = (pRVar1->reader).pointers;
  local_b8.reader.dataSize = (pRVar1->reader).dataSize;
  local_b8.reader.pointerCount = (pRVar1->reader).pointerCount;
  local_b8.reader._38_2_ = *(undefined2 *)&(pRVar1->reader).field_0x26;
  DynamicValue::Reader::Reader(&local_78,&local_b8);
  encode(__return_storage_ptr__,this,&local_78,_auStack_30);
  DynamicValue::Reader::~Reader(&local_78);
  return __return_storage_ptr__;
}

Assistant:

kj::String JsonCodec::encode(T&& value) const {
  Type type = Type::from(value);
  typedef FromAny<kj::Decay<T>> Base;
  return encode(DynamicValue::Reader(ReaderFor<Base>(kj::fwd<T>(value))), type);
}